

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

void ClearDictionary(void)

{
  DictionaryEntry *pDVar1;
  DictionaryEntry *__ptr;
  
  __ptr = dictionary_head;
  if (dictionary_head != (DictionaryEntry *)0x0) {
    do {
      pDVar1 = __ptr->next;
      free(__ptr);
      __ptr = pDVar1;
    } while (pDVar1 != (DictionaryEntry *)0x0);
  }
  dictionary_head = (DictionaryEntry *)0x0;
  return;
}

Assistant:

void ClearDictionary(void)
{
	DictionaryEntry *entry = dictionary_head;
	while (entry != NULL)
	{
		DictionaryEntry *next_entry = entry->next;
		free(entry);
		entry = next_entry;
	}

	dictionary_head = NULL;
}